

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytedata_p.h
# Opt level: O2

ssize_t __thiscall QByteDataBuffer::read(QByteDataBuffer *this,int __fd,void *__buf,size_t __nbytes)

{
  char *pcVar1;
  undefined4 in_register_00000034;
  
  (this->buffers).d.d = (Data *)0x0;
  (this->buffers).d.ptr = (QByteArray *)0x0;
  (this->buffers).d.size = 0;
  QByteArray::resize((longlong)this);
  pcVar1 = QByteArray::data((QByteArray *)this);
  read((QByteDataBuffer *)CONCAT44(in_register_00000034,__fd),(int)pcVar1,
       (void *)(this->buffers).d.size,__nbytes);
  return (ssize_t)this;
}

Assistant:

inline QByteArray read(qint64 amount)
    {
        amount = qMin(byteAmount(), amount);
        if constexpr (sizeof(qsizetype) == sizeof(int)) { // 32-bit
            // While we cannot overall have more than INT_MAX memory allocated,
            // the QByteArrays we hold may be shared copies of each other,
            // causing byteAmount() to exceed INT_MAX.
            if (amount > INT_MAX)
                qBadAlloc(); // what resize() would do if it saw past the truncation
        }
        QByteArray byteData;
        byteData.resize(qsizetype(amount));
        read(byteData.data(), byteData.size());
        return byteData;
    }